

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O0

int __thiscall
cppcms::util::filterbuf<cppcms::filters::(anonymous_namespace)::urlencode_buf,_128>::release
          (filterbuf<cppcms::filters::(anonymous_namespace)::urlencode_buf,_128> *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  filterbuf<cppcms::filters::(anonymous_namespace)::urlencode_buf,_128> *in_RDI;
  int r;
  int local_c;
  
  local_c = 0;
  if (in_RDI->output_stream_ != (ostream *)0x0) {
    sVar1 = write(in_RDI,in_ESI,in_RDX,in_RCX);
    if ((int)sVar1 != 0) {
      local_c = -1;
    }
    std::ios::rdbuf((streambuf *)
                    (in_RDI->output_stream_ + *(long *)(*(long *)in_RDI->output_stream_ + -0x18)));
    in_RDI->output_ = (streambuf *)0x0;
    in_RDI->output_stream_ = (ostream *)0x0;
  }
  return local_c;
}

Assistant:

int release()
		{
			int r=0;
			if(output_stream_) {
				if(write()!=0)
					r=-1;
				output_stream_->rdbuf(output_);
				output_=0;
				output_stream_=0;
			}
			return r;
		}